

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_KDReportsReport.cpp
# Opt level: O2

void KDReports::Report::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  qsizetype qVar2;
  code *pcVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  QArrayDataPointer<char16_t> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      documentNameChanged((Report *)_o);
      return;
    }
    if (_id == 0) {
      printingProgress((Report *)_o,*_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      puVar1 = (undefined8 *)*_a;
      documentName((QString *)&local_28,(Report *)_o);
      pDVar5 = (Data *)*puVar1;
      pcVar6 = (char16_t *)puVar1[1];
      *puVar1 = local_28.d;
      puVar1[1] = local_28.ptr;
      qVar2 = puVar1[2];
      puVar1[2] = local_28.size;
      local_28.d = pDVar5;
      local_28.ptr = pcVar6;
      local_28.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
      return;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      setDocumentName((Report *)_o,(QString *)*_a);
      return;
    }
    break;
  case IndexOfMethod:
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == printingProgress && lVar4 == 0) {
      *(undefined4 *)*_a = 0;
      return;
    }
    if (pcVar3 == documentNameChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 1;
      return;
    }
  }
  return;
}

Assistant:

void KDReports::Report::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Report *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->printingProgress((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->documentNameChanged(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Report::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Report::printingProgress)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Report::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Report::documentNameChanged)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Report *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->documentName(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Report *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDocumentName(*reinterpret_cast< QString*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}